

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

bool __thiscall
CAPSFile::GetStreamGapItem
          (CAPSFile *this,StreamItem *item,uchar *buffer,uint *offset,uint size_of_buffer)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = *offset;
  *offset = uVar3 + 1;
  bVar2 = buffer[uVar3];
  if (bVar2 == 0) {
    return false;
  }
  item->size = 0;
  item->sample_size = '\0';
  item->sample = '\0';
  *(undefined2 *)&item->field_0x6 = 0;
  uVar3 = *offset;
  do {
    if (size_of_buffer <= uVar3 || bVar2 == 0) {
      return true;
    }
    iVar1 = (uint)(bVar2 >> 5) * 8;
    uVar6 = 0;
    uVar4 = uVar3;
    while( true ) {
      iVar1 = iVar1 + -8;
      if (iVar1 == -8) break;
      *offset = uVar4 + 1;
      uVar6 = uVar6 + ((uint)buffer[uVar4] << ((byte)iVar1 & 0x1f));
      uVar4 = uVar4 + 1;
    }
    if ((bVar2 & 0x1f) == 1) {
      item->size = uVar6;
      uVar5 = *offset;
    }
    else {
      if ((bVar2 & 0x1f) != 2) {
        return size_of_buffer <= uVar3 || bVar2 == 0;
      }
      uVar5 = uVar4 + 1;
      *offset = uVar5;
      item->sample = buffer[uVar4];
      item->sample_size = (uchar)uVar6;
    }
    uVar3 = uVar5 + 1;
    *offset = uVar3;
    bVar2 = buffer[uVar5];
  } while( true );
}

Assistant:

bool CAPSFile::GetStreamGapItem(CAPSFile::StreamItem* item, unsigned char* buffer, unsigned int& offset,
                                unsigned int size_of_buffer)
{
   // Next stream item
   unsigned char b = buffer[offset++];

   if (b == 0) return false;

   memset(item, 0, sizeof(StreamItem));
   while (b != 0 && offset < size_of_buffer)
   {
      int size = b >> 5;
      int type = b & 0x1F;
      int gap_size = 0;
      for (int j = 0; j < size; j++)
      {
         gap_size += (buffer[offset++] << (8 * (size - (j + 1))));
      }

      if (type == 1)
      {
         item->size = gap_size;
      }
      else if (type == 2)
      {
         item->sample = buffer[offset++];
         item->sample_size = gap_size;
      }
      else return false;

      b = buffer[offset++];
   }
   return true;
}